

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

uint LZ4HC_countPattern(BYTE *ip,BYTE *iEnd,U32 pattern32)

{
  ulong uVar1;
  reg_t patternByte;
  ulong uVar2;
  int iVar3;
  
  iVar3 = (int)ip;
  uVar2 = (ulong)pattern32 * 0x100000001;
  do {
    if (iEnd + -7 <= ip) {
      for (; (ip < iEnd && ((char)*(ulong *)ip == (char)uVar2)); ip = (BYTE *)((long)ip + 1)) {
        uVar2 = uVar2 >> 8;
      }
LAB_0011ad37:
      return (int)ip - iVar3;
    }
    if (*(ulong *)ip != uVar2) {
      uVar2 = *(ulong *)ip ^ uVar2;
      uVar1 = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      ip = (BYTE *)((long)ip + (uVar1 >> 3 & 0x1fffffff));
      goto LAB_0011ad37;
    }
    ip = (BYTE *)((long)ip + 8);
  } while( true );
}

Assistant:

static unsigned
LZ4HC_countPattern(const BYTE* ip, const BYTE* const iEnd, U32 const pattern32)
{
    const BYTE* const iStart = ip;
    reg_t const pattern = (sizeof(pattern)==8) ?
        (reg_t)pattern32 + (((reg_t)pattern32) << (sizeof(pattern)*4)) : pattern32;

    while (likely(ip < iEnd-(sizeof(pattern)-1))) {
        reg_t const diff = LZ4_read_ARCH(ip) ^ pattern;
        if (!diff) { ip+=sizeof(pattern); continue; }
        ip += LZ4_NbCommonBytes(diff);
        return (unsigned)(ip - iStart);
    }

    if (LZ4_isLittleEndian()) {
        reg_t patternByte = pattern;
        while ((ip<iEnd) && (*ip == (BYTE)patternByte)) {
            ip++; patternByte >>= 8;
        }
    } else {  /* big endian */
        U32 bitOffset = (sizeof(pattern)*8) - 8;
        while (ip < iEnd) {
            BYTE const byte = (BYTE)(pattern >> bitOffset);
            if (*ip != byte) break;
            ip ++; bitOffset -= 8;
        }
    }

    return (unsigned)(ip - iStart);
}